

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_json_uescape(void)

{
  uint uVar1;
  int iVar2;
  int __fd;
  undefined8 uVar3;
  char *pcVar4;
  void *__buf;
  void *__buf_00;
  void *__s1;
  void *__s2;
  undefined8 uVar5;
  ulong uVar6;
  bool bVar7;
  int fd2;
  int fd1;
  int off;
  uint o;
  int unequal;
  uint8_t *expected_data;
  uint8_t *bson_data;
  char *expected_json;
  char *bson_json;
  int i;
  int n_tests;
  uencode_test_t tests [7];
  bson_t *bson_nil_byte;
  char *nil_byte;
  bson_t *bson_escapes;
  char *escapes;
  bson_t *bson_empty;
  char *empty;
  bson_t *bson_backslash;
  char *backslash;
  bson_t *bson_quote;
  char *quote;
  bson_t *bson_crlf;
  char *crlf;
  bson_t *bson_euro;
  char *euro;
  _Bool r;
  bson_t b;
  bson_error_t error;
  uint local_4f8;
  uint local_4a4;
  uint local_4a0;
  int local_478;
  char *local_470;
  long local_468;
  char *local_460;
  undefined8 local_458;
  char *local_450;
  undefined8 local_448;
  char *local_440;
  undefined8 local_438;
  char *local_430;
  undefined8 local_428;
  char *local_420;
  undefined8 local_418;
  char *local_410;
  undefined8 local_408;
  undefined8 local_3f8;
  char *local_3f0;
  undefined8 local_3e8;
  char *local_3e0;
  undefined8 local_3d8;
  char *local_3d0;
  undefined8 local_3c8;
  char *local_3c0;
  undefined8 local_3b8;
  char *local_3b0;
  undefined8 local_3a8;
  char *local_3a0;
  long local_398;
  char *local_390;
  byte local_381;
  undefined1 local_380 [4];
  uint local_37c;
  undefined1 local_290 [8];
  undefined1 auStack_288 [640];
  
  local_390 = "{ \"euro\": \"\\u20AC\"}";
  uVar3 = bson_bcon_magic();
  pcVar4 = bcon_ensure_const_char_ptr(anon_var_dwarf_344b + 0xc);
  local_398 = bcon_new(0,"euro",uVar3,0,pcVar4);
  local_3a0 = "{ \"crlf\": \"\\r\\n\"}";
  uVar3 = bson_bcon_magic();
  pcVar4 = bcon_ensure_const_char_ptr("\r\n");
  local_3a8 = bcon_new(0,"crlf",uVar3,0,pcVar4);
  local_3b0 = "{ \"quote\": \"\\\"\"}";
  uVar3 = bson_bcon_magic();
  pcVar4 = bcon_ensure_const_char_ptr("\"");
  local_3b8 = bcon_new(0,"quote",uVar3,0,pcVar4);
  local_3c0 = "{ \"backslash\": \"\\\\\"}";
  uVar3 = bson_bcon_magic();
  pcVar4 = bcon_ensure_const_char_ptr("\\");
  local_3c8 = bcon_new(0,"backslash",uVar3,0,pcVar4);
  local_3d0 = "{ \"\": \"\"}";
  uVar3 = bson_bcon_magic();
  pcVar4 = bcon_ensure_const_char_ptr("");
  local_3d8 = bcon_new(0,"",uVar3,0,pcVar4);
  local_3e0 = "{ \"escapes\": \"\\f\\b\\t\"}";
  uVar3 = bson_bcon_magic();
  pcVar4 = bcon_ensure_const_char_ptr("\f\b\t");
  local_3e8 = bcon_new(0,"escapes",uVar3,0,pcVar4);
  local_3f0 = "{ \"nil\": \"\\u0000\"}";
  local_408 = bson_new();
  local_470 = local_390;
  local_468 = local_398;
  local_460 = local_3a0;
  local_458 = local_3a8;
  local_450 = local_3b0;
  local_448 = local_3b8;
  local_440 = local_3c0;
  local_438 = local_3c8;
  local_430 = local_3d0;
  local_428 = local_3d8;
  local_420 = local_3e0;
  local_418 = local_3e8;
  local_410 = local_3f0;
  local_3f8 = local_408;
  bson_append_utf8(local_408,"nil",0xffffffff,"",1);
  local_478 = 0;
  while( true ) {
    if (6 < local_478) {
      for (local_478 = 0; local_478 < 7; local_478 = local_478 + 1) {
        bson_destroy((&local_468)[(long)local_478 * 2]);
      }
      return;
    }
    local_381 = bson_init_from_json(local_380,(&local_470)[(long)local_478 * 2],0xffffffffffffffff,
                                    local_290);
    local_381 = local_381 & 1;
    if (local_381 == 0) {
      fprintf(_stderr,"%s\n",auStack_288);
    }
    if ((local_381 & 1) == 0) {
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c"
              ,0x773,"test_bson_json_uescape","r");
      abort();
    }
    __buf = (void *)bson_get_data(local_380);
    __buf_00 = (void *)bson_get_data((&local_468)[(long)local_478 * 2]);
    local_4a4 = 0xffffffff;
    bVar7 = true;
    if (*(uint *)((&local_468)[(long)local_478 * 2] + 4) == local_37c) {
      __s1 = (void *)bson_get_data((&local_468)[(long)local_478 * 2]);
      __s2 = (void *)bson_get_data(local_380);
      iVar2 = memcmp(__s1,__s2,(ulong)*(uint *)((&local_468)[(long)local_478 * 2] + 4));
      bVar7 = iVar2 != 0;
    }
    if (bVar7) break;
    bson_destroy(local_380);
    local_478 = local_478 + 1;
  }
  uVar3 = bson_as_canonical_extended_json(local_380,0);
  uVar5 = bson_as_canonical_extended_json((&local_468)[(long)local_478 * 2],0);
  local_4a0 = 0;
  while( true ) {
    bVar7 = false;
    if (local_4a0 < local_37c) {
      bVar7 = local_4a0 < *(uint *)((&local_468)[(long)local_478 * 2] + 4);
    }
    if (!bVar7) goto LAB_001306d1;
    if (*(char *)((long)__buf + (ulong)local_4a0) != *(char *)((long)__buf_00 + (ulong)local_4a0))
    break;
    local_4a0 = local_4a0 + 1;
  }
  local_4a4 = local_4a0;
LAB_001306d1:
  if (local_4a4 == 0xffffffff) {
    if (local_37c < *(uint *)((&local_468)[(long)local_478 * 2] + 4)) {
      local_4f8 = *(uint *)((&local_468)[(long)local_478 * 2] + 4);
    }
    else {
      local_4f8 = local_37c;
    }
    local_4a4 = local_4f8 - 1;
  }
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)local_4a4,uVar3,uVar5);
  iVar2 = open("failure.bad.bson",0x42,0x1a0);
  __fd = open("failure.expected.bson",0x42,0x1a0);
  if (iVar2 == -1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x774,"test_bson_json_uescape","fd1 != -1");
    abort();
  }
  if (__fd == -1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x774,"test_bson_json_uescape","fd2 != -1");
    abort();
  }
  uVar6 = write(iVar2,__buf,(ulong)local_37c);
  if (local_37c == uVar6) {
    uVar1 = *(uint *)((&local_468)[(long)local_478 * 2] + 4);
    uVar6 = write(__fd,__buf_00,(ulong)*(uint *)((&local_468)[(long)local_478 * 2] + 4));
    if (uVar1 == uVar6) {
      close(iVar2);
      close(__fd);
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c"
              ,0x774,"test_bson_json_uescape","0");
      abort();
    }
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x774,"test_bson_json_uescape",
            "(tests[i].expected_bson)->len == bson_write (fd2, expected_data, (tests[i].expected_bson)->len)"
           );
    abort();
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          0x774,"test_bson_json_uescape","(&b)->len == bson_write (fd1, bson_data, (&b)->len)");
  abort();
}

Assistant:

static void
test_bson_json_uescape (void)
{
   bson_error_t error;
   bson_t b;
   bool r;

   const char *euro = "{ \"euro\": \"\\u20AC\"}";
   bson_t *bson_euro = BCON_NEW ("euro", BCON_UTF8 ("\xE2\x82\xAC"));

   const char *crlf = "{ \"crlf\": \"\\r\\n\"}";
   bson_t *bson_crlf = BCON_NEW ("crlf", BCON_UTF8 ("\r\n"));

   const char *quote = "{ \"quote\": \"\\\"\"}";
   bson_t *bson_quote = BCON_NEW ("quote", BCON_UTF8 ("\""));

   const char *backslash = "{ \"backslash\": \"\\\\\"}";
   bson_t *bson_backslash = BCON_NEW ("backslash", BCON_UTF8 ("\\"));

   const char *empty = "{ \"\": \"\"}";
   bson_t *bson_empty = BCON_NEW ("", BCON_UTF8 (""));

   const char *escapes = "{ \"escapes\": \"\\f\\b\\t\"}";
   bson_t *bson_escapes = BCON_NEW ("escapes", BCON_UTF8 ("\f\b\t"));

   const char *nil_byte = "{ \"nil\": \"\\u0000\"}";
   bson_t *bson_nil_byte = bson_new (); /* we'll append "\0" to it, below */

   typedef struct {
      const char *json;
      bson_t *expected_bson;
   } uencode_test_t;

   uencode_test_t tests[] = {
      {euro, bson_euro},
      {crlf, bson_crlf},
      {quote, bson_quote},
      {backslash, bson_backslash},
      {empty, bson_empty},
      {escapes, bson_escapes},
      {nil_byte, bson_nil_byte},
   };

   int n_tests = sizeof (tests) / sizeof (uencode_test_t);
   int i;

   bson_append_utf8 (bson_nil_byte, "nil", -1, "\0", 1);

   for (i = 0; i < n_tests; i++) {
      r = bson_init_from_json (&b, tests[i].json, -1, &error);

      if (!r) {
         fprintf (stderr, "%s\n", error.message);
      }

      BSON_ASSERT (r);
      bson_eq_bson (&b, tests[i].expected_bson);
      bson_destroy (&b);
   }

   for (i = 0; i < n_tests; i++) {
      bson_destroy (tests[i].expected_bson);
   }
}